

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O2

string * __thiscall
pbrt::MediumInteraction::ToString_abi_cxx11_(string *__return_storage_ptr__,MediumInteraction *this)

{
  ulong uVar1;
  MediumInterface *this_00;
  ulong uVar2;
  char **in_stack_ffffffffffffff38;
  char *local_a8;
  char *local_a0;
  string local_98;
  char *local_78;
  string local_70;
  string local_50;
  
  uVar1 = (this->super_Interaction).medium.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  local_a0 = "(nullptr)";
  if ((uVar1 & 0xffffffffffff) != 0) {
    MediumHandle::ToString_abi_cxx11_(&local_50,&(this->super_Interaction).medium);
    local_a0 = local_50._M_dataplus._M_p;
  }
  this_00 = (this->super_Interaction).mediumInterface;
  local_a8 = "(nullptr)";
  if (this_00 != (MediumInterface *)0x0) {
    MediumInterface::ToString_abi_cxx11_(&local_70,this_00);
    local_a8 = local_70._M_dataplus._M_p;
  }
  uVar2 = (this->phase).super_TaggedPointer<pbrt::HGPhaseFunction>.bits;
  local_78 = "(nullptr)";
  if ((uVar2 & 0xffffffffffff) != 0) {
    PhaseFunctionHandle::ToString_abi_cxx11_(&local_98,&this->phase);
    local_78 = local_98._M_dataplus._M_p;
  }
  StringPrintf<pbrt::Point3fi_const&,pbrt::Normal3<float>const&,pbrt::Point2<float>const&,pbrt::Vector3<float>const&,float_const&,pbrt::SampledSpectrum_const&,pbrt::SampledSpectrum_const&,pbrt::SampledSpectrum_const&,pbrt::SampledSpectrum_const&,char_const*,char_const*,char_const*>
            (__return_storage_ptr__,
             (pbrt *)
             "[ MediumInteraction pi: %s n: %s uv: %s wo: %s time: %s sigma_a: %s sigma_s: %s sigma_maj: %s Le: %s medium: %s mediumInterface: %s phase: %s ]"
             ,(char *)this,(Point3fi *)&(this->super_Interaction).n,
             (Normal3<float> *)&(this->super_Interaction).uv,
             (Point2<float> *)&(this->super_Interaction).wo,
             (Vector3<float> *)&(this->super_Interaction).time,(float *)&this->sigma_a,
             &this->sigma_s,&this->sigma_maj,&this->Le,(SampledSpectrum *)&local_a0,&local_a8,
             &local_78,in_stack_ffffffffffffff38);
  if ((uVar2 & 0xffffffffffff) != 0) {
    std::__cxx11::string::~string((string *)&local_98);
  }
  if (this_00 != (MediumInterface *)0x0) {
    std::__cxx11::string::~string((string *)&local_70);
  }
  if ((uVar1 & 0xffffffffffff) != 0) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MediumInteraction::ToString() const {
    return StringPrintf(
        "[ MediumInteraction pi: %s n: %s uv: %s wo: %s time: %s "
        "sigma_a: %s sigma_s: %s sigma_maj: %s Le: %s medium: %s mediumInterface: %s "
        "phase: %s ]",
        pi, n, uv, wo, time, sigma_a, sigma_s, sigma_maj, Le,
        medium ? medium.ToString().c_str() : "(nullptr)",
        mediumInterface ? mediumInterface->ToString().c_str() : "(nullptr)",
        phase ? phase.ToString().c_str() : "(nullptr)");
}